

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O2

double __thiscall Preceptron_SIGMOID::Forward(Preceptron_SIGMOID *this)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  
  (this->super_Preceptron).output = 0.0;
  pdVar1 = (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pdVar3 = (this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar5 = 0.0;
  for (lVar4 = 0; (long)pdVar2 - (long)pdVar1 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    dVar6 = pdVar1[lVar4] * pdVar3[lVar4];
    if (((this->super_Preceptron).useBias & 1U) != 0) {
      dVar6 = dVar6 + (this->super_Preceptron).bias;
    }
    dVar5 = dVar5 + dVar6;
    (this->super_Preceptron).output = dVar5;
  }
  (*(this->super_Preceptron)._vptr_Preceptron[1])(this);
  (this->super_Preceptron).output = extraout_XMM0_Qa;
  return extraout_XMM0_Qa;
}

Assistant:

double Forward() {
		output = 0.0;
		for (int i = 0; i < weight.size(); i++) {
			output += useBias ? (weight[i] * input[i] + bias) : (weight[i] * input[i]);
		}
		output = Activiation(output);
		return output;
	}